

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

parser_error parse_always(parser *p)

{
  long lVar1;
  object_base *poVar2;
  _Bool _Var3;
  wchar_t tval_00;
  wchar_t sval_00;
  void *pvVar4;
  char *pcVar5;
  object_kind *poVar6;
  class_book_conflict *pcVar7;
  void *pvVar8;
  class_book *book;
  wchar_t i;
  object_base *book_base;
  wchar_t sval;
  object_kind *kind;
  wchar_t tval;
  store *s;
  parser *p_local;
  
  pvVar4 = parser_priv(p);
  pcVar5 = parser_getsym(p,"tval");
  tval_00 = tval_find_idx(pcVar5);
  _Var3 = parser_hasval(p,"sval");
  poVar2 = kb_info;
  if (_Var3) {
    pcVar5 = parser_getsym(p,"sval");
    sval_00 = lookup_sval(tval_00,pcVar5);
    poVar6 = lookup_kind(tval_00,sval_00);
    if (poVar6 == (object_kind *)0x0) {
      return PARSE_ERROR_UNRECOGNISED_SVAL;
    }
    if (*(long *)((long)pvVar4 + 0x50) == 0) {
      *(undefined8 *)((long)pvVar4 + 0x48) = 8;
      pvVar8 = mem_zalloc(*(long *)((long)pvVar4 + 0x48) << 3);
      *(void **)((long)pvVar4 + 0x58) = pvVar8;
    }
    else if (*(ulong *)((long)pvVar4 + 0x48) <= *(ulong *)((long)pvVar4 + 0x50)) {
      *(long *)((long)pvVar4 + 0x48) = *(long *)((long)pvVar4 + 0x48) + 8;
      pvVar8 = mem_realloc(*(void **)((long)pvVar4 + 0x58),*(long *)((long)pvVar4 + 0x48) << 3);
      *(void **)((long)pvVar4 + 0x58) = pvVar8;
    }
    lVar1 = *(long *)((long)pvVar4 + 0x50);
    *(long *)((long)pvVar4 + 0x50) = lVar1 + 1;
    *(object_kind **)(*(long *)((long)pvVar4 + 0x58) + lVar1 * 8) = poVar6;
  }
  else {
    for (book._4_4_ = L'\x01'; book._4_4_ <= poVar2[tval_00].num_svals;
        book._4_4_ = book._4_4_ + L'\x01') {
      poVar6 = lookup_kind(tval_00,book._4_4_);
      pcVar7 = object_kind_to_book(poVar6);
      if ((pcVar7->dungeon & 1U) == 0) {
        if (*(long *)((long)pvVar4 + 0x50) == 0) {
          *(undefined8 *)((long)pvVar4 + 0x48) = 8;
          pvVar8 = mem_zalloc(*(long *)((long)pvVar4 + 0x48) << 3);
          *(void **)((long)pvVar4 + 0x58) = pvVar8;
        }
        else if (*(ulong *)((long)pvVar4 + 0x48) <= *(ulong *)((long)pvVar4 + 0x50)) {
          *(long *)((long)pvVar4 + 0x48) = *(long *)((long)pvVar4 + 0x48) + 8;
          pvVar8 = mem_realloc(*(void **)((long)pvVar4 + 0x58),*(long *)((long)pvVar4 + 0x48) << 3);
          *(void **)((long)pvVar4 + 0x58) = pvVar8;
        }
        lVar1 = *(long *)((long)pvVar4 + 0x50);
        *(long *)((long)pvVar4 + 0x50) = lVar1 + 1;
        *(object_kind **)(*(long *)((long)pvVar4 + 0x58) + lVar1 * 8) = poVar6;
      }
    }
  }
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_always(struct parser *p) {
	struct store *s = parser_priv(p);
	int tval = tval_find_idx(parser_getsym(p, "tval"));
	struct object_kind *kind = NULL;

	/* Mostly svals are given, but special handling is needed for books */
	if (parser_hasval(p, "sval")) {
		int sval = lookup_sval(tval, parser_getsym(p, "sval"));
		kind = lookup_kind(tval, sval);
		if (!kind) {
			return PARSE_ERROR_UNRECOGNISED_SVAL;
		}

		/* Expand if necessary */
		if (!s->always_num) {
			s->always_size = 8;
			s->always_table = mem_zalloc(s->always_size *
										 sizeof *s->always_table);
		} else if (s->always_num >= s->always_size) {
			s->always_size += 8;
			s->always_table = mem_realloc(s->always_table, s->always_size *
										  sizeof *s->always_table);
		}

		s->always_table[s->always_num++] = kind;
	} else {
		/* Books */
		struct object_base *book_base = &kb_info[tval];
		int i;

		/* Run across all the books for this type, add the town books */
		for (i = 1; i <= book_base->num_svals; i++) {
			const struct class_book *book = NULL;
			kind = lookup_kind(tval, i);
			book = object_kind_to_book(kind);
			if (!book->dungeon) {
				/* Expand if necessary */
				if (!s->always_num) {
					s->always_size = 8;
					s->always_table = mem_zalloc(s->always_size *
												 sizeof *s->always_table);
				} else if (s->always_num >= s->always_size) {
					s->always_size += 8;
					s->always_table = mem_realloc(s->always_table,
												  s->always_size *
												  sizeof *s->always_table);
				}

				s->always_table[s->always_num++] = kind;
			}
		}
	}

	return PARSE_ERROR_NONE;
}